

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryMaterial(AssbinImporter *this,IOStream *stream,aiMaterial *mat)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *this_00;
  DeadlyImportError *this_01;
  aiMaterialProperty *this_02;
  uint i;
  ulong uVar3;
  allocator<char> local_49;
  string local_48;
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 != 0x123d) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Magic chunk identifiers are wrong!",&local_49);
    DeadlyImportError::DeadlyImportError(this_01,&local_48);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  uVar1 = Read<unsigned_int>(stream);
  mat->mNumProperties = uVar1;
  mat->mNumAllocated = uVar1;
  if (uVar1 != 0) {
    if (mat->mProperties != (aiMaterialProperty **)0x0) {
      operator_delete__(mat->mProperties);
      uVar1 = mat->mNumProperties;
    }
    ppaVar2 = (aiMaterialProperty **)operator_new__((ulong)uVar1 << 3);
    mat->mProperties = ppaVar2;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      this_00 = (aiMaterialProperty *)operator_new(0x420);
      this_02 = this_00;
      aiMaterialProperty::aiMaterialProperty(this_00);
      mat->mProperties[uVar3] = this_00;
      ReadBinaryMaterialProperty((AssbinImporter *)this_02,stream,mat->mProperties[uVar3]);
      uVar1 = mat->mNumProperties;
    }
  }
  return;
}

Assistant:

void AssbinImporter::ReadBinaryMaterial(IOStream * stream, aiMaterial* mat) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMATERIAL)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    mat->mNumAllocated = mat->mNumProperties = Read<unsigned int>(stream);
    if (mat->mNumProperties)
    {
        if (mat->mProperties)
        {
            delete[] mat->mProperties;
        }
        mat->mProperties = new aiMaterialProperty*[mat->mNumProperties];
        for (unsigned int i = 0; i < mat->mNumProperties;++i) {
            mat->mProperties[i] = new aiMaterialProperty();
            ReadBinaryMaterialProperty( stream, mat->mProperties[i]);
        }
    }
}